

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void memory_tree_ns::finish(memory_tree *b)

{
  v_array<memory_tree_ns::node> *pvVar1;
  size_t sVar2;
  long in_RDI;
  size_t i_1;
  size_t i;
  v_array<memory_tree_ns::node> *this;
  ulong local_18;
  v_array<memory_tree_ns::node> *local_10;
  
  local_10 = (v_array<memory_tree_ns::node> *)0x0;
  while( true ) {
    this = local_10;
    pvVar1 = (v_array<memory_tree_ns::node> *)
             v_array<memory_tree_ns::node>::size((v_array<memory_tree_ns::node> *)(in_RDI + 8));
    if (pvVar1 <= this) break;
    v_array<memory_tree_ns::node>::operator[]
              ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(size_t)local_10);
    v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)this);
    local_10 = (v_array<memory_tree_ns::node> *)((long)&local_10->_begin + 1);
  }
  v_array<memory_tree_ns::node>::delete_v(this);
  local_18 = 0;
  while( true ) {
    sVar2 = v_array<example_*>::size((v_array<example_*> *)(in_RDI + 0x28));
    if (sVar2 <= local_18) break;
    v_array<example_*>::operator[]((v_array<example_*> *)(in_RDI + 0x28),local_18);
    free_example((example *)0x2b51fb);
    local_18 = local_18 + 1;
  }
  v_array<example_*>::delete_v((v_array<example_*> *)this);
  free_example((example *)0x2b522a);
  return;
}

Assistant:

void finish(memory_tree& b)
    {
        for (size_t i = 0; i < b.nodes.size(); ++i)
            b.nodes[i].examples_index.delete_v();
        b.nodes.delete_v();
        for (size_t i = 0; i < b.examples.size(); i++)
            free_example(b.examples[i]);
        b.examples.delete_v();
        free_example(b.kprod_ec);
        //cout<<b.max_nodes<<endl;
        //cout<<b.construct_time<<" "<<b.test_time<<endl;
    }